

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

uint32_t __thiscall Catch::anon_unknown_1::TestHasher::operator()(TestHasher *this,TestCase *t)

{
  bool bVar1;
  reference pcVar2;
  long lVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  uint32_t high;
  uint32_t low;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  hash_t hash;
  hash_t prime;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30 [2];
  ulong local_20;
  undefined8 local_18;
  
  local_18 = 0x100000001b3;
  local_20 = 0xcbf29ce484222325;
  local_30[0]._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(in_RDI,in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_30);
    local_20 = ((long)*pcVar2 ^ local_20) * 0x100000001b3;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_30);
  }
  lVar3 = ((ulong)in_RDI->_M_current ^ local_20) * 0x100000001b3;
  return (int)lVar3 * (int)((ulong)lVar3 >> 0x20);
}

Assistant:

uint32_t operator()( TestCase const& t ) const {
                // FNV-1a hash with multiplication fold.
                const hash_t prime = 1099511628211u;
                hash_t hash = 14695981039346656037u;
                for ( const char c : t.name ) {
                    hash ^= c;
                    hash *= prime;
                }
                hash ^= m_hashSuffix;
                hash *= prime;
                const uint32_t low{ static_cast<uint32_t>( hash ) };
                const uint32_t high{ static_cast<uint32_t>( hash >> 32 ) };
                return low * high;
            }